

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpmux.c
# Opt level: O0

int Process(Config *config)

{
  int iVar1;
  WebPMuxError WVar2;
  WebPMux *pWVar3;
  void *pvVar4;
  char *pcVar5;
  long in_RDI;
  WebPMuxFrameInfo frame_1;
  int nb_args;
  int end;
  int start;
  int duration;
  int args [3];
  int k;
  WebPMux *new_mux;
  int *durations;
  int i_1;
  int num_frames;
  uint32_t bgcolor_1;
  WebPMuxAnimParams params_2;
  int loop_count_1;
  int parse_error_1;
  WebPMuxAnimParams params_1;
  WebPMuxFrameInfo frame;
  int loop_count;
  int parse_error;
  uint32_t bgcolor;
  WebPMuxAnimParams params;
  int i;
  int ok;
  WebPMuxError err;
  WebPData chunk;
  WebPMux *mux;
  int in_stack_fffffffffffffe9c;
  WebPData *in_stack_fffffffffffffea0;
  FILE *pFVar6;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  WebPData *in_stack_fffffffffffffeb0;
  WebPMux *in_stack_fffffffffffffeb8;
  WebPMuxFrameInfo *in_stack_fffffffffffffec0;
  WebPMux *in_stack_fffffffffffffec8;
  Config *in_stack_ffffffffffffff08;
  WebPMux *in_stack_ffffffffffffff10;
  int local_dc;
  int in_stack_ffffffffffffff3c;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  int local_b0;
  int local_ac;
  uint local_94;
  int local_90;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  uint local_2c;
  uint local_28;
  
  local_28 = 1;
  switch(*(undefined4 *)(in_RDI + 0x28)) {
  case 1:
    iVar1 = CreateMux((char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                      (WebPMux **)in_stack_fffffffffffffea0);
    if (iVar1 == 0) {
      local_28 = 0;
    }
    else if (*(int *)(in_RDI + 0x40) - 1U < 3) {
      WVar2 = WebPMuxGetChunk(in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0,
                              (WebPData *)
                              CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      pFVar6 = _stderr;
      if (WVar2 == WEBP_MUX_OK) {
        local_28 = WriteData((char *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      }
      else {
        pcVar5 = ErrorString(WVar2);
        fprintf(pFVar6,"ERROR (%s): Could not get the %s.\n",pcVar5,
                kDescriptions[*(uint *)(in_RDI + 0x40)]);
        local_28 = 0;
      }
    }
    else if (*(int *)(in_RDI + 0x40) == 4) {
      local_28 = GetFrame(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    }
    else {
      fprintf(_stderr,"ERROR: Invalid feature for action \'get\'.\n");
      local_28 = 0;
    }
    break;
  case 2:
    switch(*(undefined4 *)(in_RDI + 0x40)) {
    case 1:
    case 2:
    case 3:
      iVar1 = CreateMux((char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                        (WebPMux **)in_stack_fffffffffffffea0);
      if (iVar1 == 0) {
        local_28 = 0;
        goto LAB_0010366d;
      }
      iVar1 = ExUtilReadFileToWebPData
                        ((char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                         in_stack_fffffffffffffea0);
      if (iVar1 == 0) {
        local_28 = 0;
        goto LAB_0010366d;
      }
      WVar2 = WebPMuxSetChunk(in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0,
                              (WebPData *)
                              CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                              (int)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      WebPDataClear((WebPData *)0x102bcd);
      if (WVar2 != WEBP_MUX_OK) {
        pFVar6 = _stderr;
        pcVar5 = ErrorString(WVar2);
        fprintf(pFVar6,"ERROR (%s): Could not set the %s.\n",pcVar5,
                kDescriptions[*(uint *)(in_RDI + 0x40)]);
        local_28 = 0;
        goto LAB_0010366d;
      }
      break;
    case 4:
      pWVar3 = WebPMuxNew();
      pFVar6 = _stderr;
      if (pWVar3 == (WebPMux *)0x0) {
        pcVar5 = ErrorString(WEBP_MUX_MEMORY_ERROR);
        fprintf(pFVar6,"ERROR (%s): Could not allocate a mux object.\n",pcVar5);
        local_28 = 0;
        goto LAB_0010366d;
      }
      for (local_2c = 0; (int)local_2c < *(int *)(in_RDI + 0x50); local_2c = local_2c + 1) {
        iVar1 = *(int *)(*(long *)(in_RDI + 0x48) + (long)(int)local_2c * 0x18);
        if (iVar1 == 1) {
          iVar1 = ExUtilReadFileToWebPData
                            ((char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                             in_stack_fffffffffffffea0);
          if (iVar1 == 0) {
            local_28 = 0;
            goto LAB_0010366d;
          }
          iVar1 = ParseFrameArgs((char *)in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
          if (iVar1 == 0) {
            WebPDataClear((WebPData *)0x1029c9);
            fprintf(_stderr,"ERROR: Could not parse frame properties.\n");
            local_28 = 0;
            goto LAB_0010366d;
          }
          WVar2 = WebPMuxPushFrame((WebPMux *)
                                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                                   (WebPMuxFrameInfo *)
                                   CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                                   in_stack_ffffffffffffff3c);
          WebPDataClear((WebPData *)0x102a1f);
          pFVar6 = _stderr;
          if (WVar2 != WEBP_MUX_OK) {
            pcVar5 = ErrorString(WVar2);
            fprintf(pFVar6,"ERROR (%s): Could not add a frame at index %d.\n",pcVar5,(ulong)local_2c
                   );
            local_28 = 0;
            goto LAB_0010366d;
          }
        }
        else if (iVar1 == 2) {
          iVar1 = ExUtilGetInt((char *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                               (int *)0x1028af);
          if ((iVar1 < 0) || (0xffff < iVar1)) {
            fprintf(_stderr,"ERROR: Loop count must be in the range 0 to 65535.\n");
            local_28 = 0;
            goto LAB_0010366d;
          }
        }
        else {
          if (iVar1 != 3) {
            fprintf(_stderr,"ERROR: Invalid subtype for \'frame\'");
            local_28 = 0;
            goto LAB_0010366d;
          }
          iVar1 = ParseBgcolorArgs((char *)CONCAT44(in_stack_fffffffffffffeac,
                                                    in_stack_fffffffffffffea8),
                                   (uint32_t *)in_stack_fffffffffffffea0);
          if (iVar1 == 0) {
            fprintf(_stderr,"ERROR: Could not parse the background color \n");
            local_28 = 0;
            goto LAB_0010366d;
          }
        }
      }
      WVar2 = WebPMuxSetAnimationParams
                        (in_stack_fffffffffffffeb8,(WebPMuxAnimParams *)in_stack_fffffffffffffeb0);
      if (WVar2 != WEBP_MUX_OK) {
        pFVar6 = _stderr;
        pcVar5 = ErrorString(WVar2);
        fprintf(pFVar6,"ERROR (%s): Could not set animation parameters.\n",pcVar5);
        local_28 = 0;
        goto LAB_0010366d;
      }
      break;
    default:
      fprintf(_stderr,"ERROR: Invalid feature for action \'set\'.\n");
      local_28 = 0;
      goto LAB_0010366d;
    case 6:
      iVar1 = ExUtilGetInt((char *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                           (int *)0x102c73);
      if ((iVar1 < 0) || (0xffff < iVar1)) {
        fprintf(_stderr,"ERROR: Loop count must be in the range 0 to 65535.\n");
        local_28 = 0;
        goto LAB_0010366d;
      }
      iVar1 = CreateMux((char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                        (WebPMux **)in_stack_fffffffffffffea0);
      if (iVar1 == 0) {
        local_28 = 0;
        goto LAB_0010366d;
      }
      WVar2 = WebPMuxGetAnimationParams
                        (in_stack_fffffffffffffeb8,(WebPMuxAnimParams *)in_stack_fffffffffffffeb0);
      if (WVar2 != WEBP_MUX_OK) {
        fprintf(_stderr,"ERROR: input file does not seem to be an animation.\n");
        local_28 = 0;
        goto LAB_0010366d;
      }
      WVar2 = WebPMuxSetAnimationParams
                        (in_stack_fffffffffffffeb8,(WebPMuxAnimParams *)in_stack_fffffffffffffeb0);
      if (WVar2 != WEBP_MUX_OK) {
        pFVar6 = _stderr;
        pcVar5 = ErrorString(WVar2);
        fprintf(pFVar6,"ERROR (%s): Could not set animation parameters.\n",pcVar5);
        local_28 = 0;
        goto LAB_0010366d;
      }
      break;
    case 7:
      iVar1 = ParseBgcolorArgs((char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)
                               ,(uint32_t *)in_stack_fffffffffffffea0);
      if (iVar1 == 0) {
        fprintf(_stderr,"ERROR: Could not parse the background color.\n");
        local_28 = 0;
        goto LAB_0010366d;
      }
      iVar1 = CreateMux((char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                        (WebPMux **)in_stack_fffffffffffffea0);
      if (iVar1 == 0) {
        local_28 = 0;
        goto LAB_0010366d;
      }
      WVar2 = WebPMuxGetAnimationParams
                        (in_stack_fffffffffffffeb8,(WebPMuxAnimParams *)in_stack_fffffffffffffeb0);
      if (WVar2 != WEBP_MUX_OK) {
        fprintf(_stderr,"ERROR: input file does not seem to be an animation.\n");
        local_28 = 0;
        goto LAB_0010366d;
      }
      WVar2 = WebPMuxSetAnimationParams
                        (in_stack_fffffffffffffeb8,(WebPMuxAnimParams *)in_stack_fffffffffffffeb0);
      if (WVar2 != WEBP_MUX_OK) {
        pFVar6 = _stderr;
        pcVar5 = ErrorString(WVar2);
        fprintf(pFVar6,"ERROR (%s): Could not set animation parameters.\n",pcVar5);
        local_28 = 0;
        goto LAB_0010366d;
      }
    }
    local_28 = WriteWebP(in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0);
    break;
  case 3:
    iVar1 = CreateMux((char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                      (WebPMux **)in_stack_fffffffffffffea0);
    if (iVar1 == 0) {
      local_28 = 0;
    }
    else if (((*(int *)(in_RDI + 0x40) == 3) || (*(int *)(in_RDI + 0x40) == 1)) ||
            (*(int *)(in_RDI + 0x40) == 2)) {
      WVar2 = WebPMuxDeleteChunk((WebPMux *)
                                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                                 (char *)in_stack_fffffffffffffea0);
      if (WVar2 == WEBP_MUX_OK) {
        local_28 = WriteWebP(in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0);
      }
      else {
        pFVar6 = _stderr;
        pcVar5 = ErrorString(WVar2);
        fprintf(pFVar6,"ERROR (%s): Could not strip the %s.\n",pcVar5,
                kDescriptions[*(uint *)(in_RDI + 0x40)]);
        local_28 = 0;
      }
    }
    else {
      fprintf(_stderr,"ERROR: Invalid feature for action \'strip\'.\n");
      local_28 = 0;
    }
    break;
  case 4:
    iVar1 = CreateMux((char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                      (WebPMux **)in_stack_fffffffffffffea0);
    if (iVar1 == 0) {
      local_28 = 0;
    }
    else {
      WVar2 = DisplayInfo((WebPMux *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      local_28 = (uint)(WVar2 == WEBP_MUX_OK);
    }
    break;
  default:
    break;
  case 6:
    iVar1 = CreateMux((char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                      (WebPMux **)in_stack_fffffffffffffea0);
    if (iVar1 == 0) {
      local_28 = 0;
    }
    else {
      WVar2 = WebPMuxNumChunks(in_stack_fffffffffffffeb8,
                               (WebPChunkId)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                               (int *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8))
      ;
      local_28 = (uint)(WVar2 == WEBP_MUX_OK);
      if (local_28 == 0) {
        fprintf(_stderr,"ERROR: can not parse the number of frames.\n");
        local_28 = 0;
      }
      else if (local_90 == 0) {
        fprintf(_stderr,"Doesn\'t look like the source is animated. Skipping duration setting.\n");
        local_28 = WriteWebP(in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0);
      }
      else {
        pWVar3 = DuplicateMuxHeader(in_stack_fffffffffffffec8);
        if ((pWVar3 != (WebPMux *)0x0) && (pvVar4 = WebPMalloc(0x1030e5), pvVar4 != (void *)0x0)) {
          for (local_94 = 0; (int)local_94 < local_90; local_94 = local_94 + 1) {
            *(undefined4 *)((long)pvVar4 + (long)(int)local_94 * 4) = 0xffffffff;
          }
          for (local_94 = 0; (int)local_94 < *(int *)(in_RDI + 0x50); local_94 = local_94 + 1) {
            in_stack_ffffffffffffff44 = in_stack_ffffffffffffff48;
            iVar1 = ExUtilGetInts((char *)in_stack_fffffffffffffeb8,
                                  (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                                  (int)in_stack_fffffffffffffeb0,
                                  (int *)CONCAT44(in_stack_fffffffffffffeac,
                                                  in_stack_fffffffffffffea8));
            if (iVar1 < 1) {
              local_28 = 0;
              goto LAB_001034b3;
            }
            if (in_stack_ffffffffffffff44 < 0) {
              fprintf(_stderr,"ERROR: duration must be strictly positive.\n");
              local_28 = 0;
              goto LAB_001034b3;
            }
            if (iVar1 == 1) {
              local_ac = 1;
              in_stack_ffffffffffffff40 = local_ac;
              in_stack_ffffffffffffff3c = local_90;
            }
            else {
              if (in_stack_ffffffffffffff4c < 1) {
                local_ac = 1;
              }
              else {
                local_ac = in_stack_ffffffffffffff4c;
                if (local_90 < in_stack_ffffffffffffff4c) {
                  local_ac = local_90;
                }
              }
              in_stack_fffffffffffffeac = local_ac;
              if (2 < iVar1) {
                in_stack_fffffffffffffeac = local_b0;
              }
              in_stack_ffffffffffffff40 = local_ac;
              if ((in_stack_fffffffffffffeac == 0) ||
                 (in_stack_ffffffffffffff3c = in_stack_fffffffffffffeac,
                 local_90 < in_stack_fffffffffffffeac)) {
                in_stack_ffffffffffffff3c = local_90;
              }
            }
            for (; local_ac <= in_stack_ffffffffffffff3c; local_ac = local_ac + 1) {
              *(int *)((long)pvVar4 + (long)(local_ac + -1) * 4) = in_stack_ffffffffffffff44;
            }
            in_stack_ffffffffffffff48 = in_stack_ffffffffffffff44;
          }
          for (local_94 = 1; (int)local_94 <= local_90; local_94 = local_94 + 1) {
            WVar2 = WebPMuxGetFrame(in_stack_fffffffffffffeb8,
                                    (uint32_t)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                                    (WebPMuxFrameInfo *)
                                    CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
            if ((WVar2 != WEBP_MUX_OK) || (local_dc != 3)) {
              fprintf(_stderr,"ERROR: can not retrieve frame #%d.\n",(ulong)local_94);
              local_28 = 0;
              goto LAB_001034b3;
            }
            WVar2 = WebPMuxPushFrame((WebPMux *)
                                     CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                                     (WebPMuxFrameInfo *)
                                     CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                                     in_stack_ffffffffffffff3c);
            if (WVar2 != WEBP_MUX_OK) {
              fprintf(_stderr,"ERROR: error push frame data #%d\n",(ulong)local_94);
              local_28 = 0;
              goto LAB_001034b3;
            }
            WebPDataClear((WebPData *)0x103454);
          }
          WebPMuxDelete((WebPMux *)0x103477);
          local_28 = WriteWebP(in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0);
LAB_001034b3:
          WebPFree((void *)0x1034c0);
          WebPMuxDelete((WebPMux *)0x1034cd);
        }
      }
    }
  }
LAB_0010366d:
  WebPMuxDelete((WebPMux *)0x10367a);
  return local_28;
}

Assistant:

static int Process(const Config* config) {
  WebPMux* mux = NULL;
  WebPData chunk;
  WebPMuxError err = WEBP_MUX_OK;
  int ok = 1;

  switch (config->action_type_) {
    case ACTION_GET: {
      ok = CreateMux(config->input_, &mux);
      if (!ok) goto Err2;
      switch (config->type_) {
        case FEATURE_ANMF:
          ok = GetFrame(mux, config);
          break;

        case FEATURE_ICCP:
        case FEATURE_EXIF:
        case FEATURE_XMP:
          err = WebPMuxGetChunk(mux, kFourccList[config->type_], &chunk);
          if (err != WEBP_MUX_OK) {
            ERROR_GOTO3("ERROR (%s): Could not get the %s.\n",
                        ErrorString(err), kDescriptions[config->type_], Err2);
          }
          ok = WriteData(config->output_, &chunk);
          break;

        default:
          ERROR_GOTO1("ERROR: Invalid feature for action 'get'.\n", Err2);
          break;
      }
      break;
    }
    case ACTION_SET: {
      switch (config->type_) {
        case FEATURE_ANMF: {
          int i;
          WebPMuxAnimParams params = { 0xFFFFFFFF, 0 };
          mux = WebPMuxNew();
          if (mux == NULL) {
            ERROR_GOTO2("ERROR (%s): Could not allocate a mux object.\n",
                        ErrorString(WEBP_MUX_MEMORY_ERROR), Err2);
          }
          for (i = 0; i < config->arg_count_; ++i) {
            switch (config->args_[i].subtype_) {
              case SUBTYPE_BGCOLOR: {
                uint32_t bgcolor;
                ok = ParseBgcolorArgs(config->args_[i].params_, &bgcolor);
                if (!ok) {
                  ERROR_GOTO1("ERROR: Could not parse the background color \n",
                              Err2);
                }
                params.bgcolor = bgcolor;
                break;
              }
              case SUBTYPE_LOOP: {
                int parse_error = 0;
                const int loop_count =
                    ExUtilGetInt(config->args_[i].params_, 10, &parse_error);
                if (loop_count < 0 || loop_count > 65535) {
                  // Note: This is only a 'necessary' condition for loop_count
                  // to be valid. The 'sufficient' conditioned in checked in
                  // WebPMuxSetAnimationParams() method called later.
                  ERROR_GOTO1("ERROR: Loop count must be in the range 0 to "
                              "65535.\n", Err2);
                }
                ok = !parse_error;
                if (!ok) goto Err2;
                params.loop_count = loop_count;
                break;
              }
              case SUBTYPE_ANMF: {
                WebPMuxFrameInfo frame;
                frame.id = WEBP_CHUNK_ANMF;
                ok = ExUtilReadFileToWebPData(config->args_[i].filename_,
                                              &frame.bitstream);
                if (!ok) goto Err2;
                ok = ParseFrameArgs(config->args_[i].params_, &frame);
                if (!ok) {
                  WebPDataClear(&frame.bitstream);
                  ERROR_GOTO1("ERROR: Could not parse frame properties.\n",
                              Err2);
                }
                err = WebPMuxPushFrame(mux, &frame, 1);
                WebPDataClear(&frame.bitstream);
                if (err != WEBP_MUX_OK) {
                  ERROR_GOTO3("ERROR (%s): Could not add a frame at index %d."
                              "\n", ErrorString(err), i, Err2);
                }
                break;
              }
              default: {
                ERROR_GOTO1("ERROR: Invalid subtype for 'frame'", Err2);
                break;
              }
            }
          }
          err = WebPMuxSetAnimationParams(mux, &params);
          if (err != WEBP_MUX_OK) {
            ERROR_GOTO2("ERROR (%s): Could not set animation parameters.\n",
                        ErrorString(err), Err2);
          }
          break;
        }

        case FEATURE_ICCP:
        case FEATURE_EXIF:
        case FEATURE_XMP: {
          ok = CreateMux(config->input_, &mux);
          if (!ok) goto Err2;
          ok = ExUtilReadFileToWebPData(config->args_[0].filename_, &chunk);
          if (!ok) goto Err2;
          err = WebPMuxSetChunk(mux, kFourccList[config->type_], &chunk, 1);
          WebPDataClear(&chunk);
          if (err != WEBP_MUX_OK) {
            ERROR_GOTO3("ERROR (%s): Could not set the %s.\n",
                        ErrorString(err), kDescriptions[config->type_], Err2);
          }
          break;
        }
        case FEATURE_LOOP: {
          WebPMuxAnimParams params = { 0xFFFFFFFF, 0 };
          int parse_error = 0;
          const int loop_count =
              ExUtilGetInt(config->args_[0].params_, 10, &parse_error);
          if (loop_count < 0 || loop_count > 65535 || parse_error) {
            ERROR_GOTO1("ERROR: Loop count must be in the range 0 to 65535.\n",
                        Err2);
          }
          ok = CreateMux(config->input_, &mux);
          if (!ok) goto Err2;
          ok = (WebPMuxGetAnimationParams(mux, &params) == WEBP_MUX_OK);
          if (!ok) {
            ERROR_GOTO1("ERROR: input file does not seem to be an animation.\n",
                        Err2);
          }
          params.loop_count = loop_count;
          err = WebPMuxSetAnimationParams(mux, &params);
          ok = (err == WEBP_MUX_OK);
          if (!ok) {
            ERROR_GOTO2("ERROR (%s): Could not set animation parameters.\n",
                        ErrorString(err), Err2);
          }
          break;
        }
        case FEATURE_BGCOLOR: {
          WebPMuxAnimParams params = { 0xFFFFFFFF, 0 };
          uint32_t bgcolor;
          ok = ParseBgcolorArgs(config->args_[0].params_, &bgcolor);
          if (!ok) {
            ERROR_GOTO1("ERROR: Could not parse the background color.\n",
                        Err2);
          }
          ok = CreateMux(config->input_, &mux);
          if (!ok) goto Err2;
          ok = (WebPMuxGetAnimationParams(mux, &params) == WEBP_MUX_OK);
          if (!ok) {
            ERROR_GOTO1("ERROR: input file does not seem to be an animation.\n",
                        Err2);
          }
          params.bgcolor = bgcolor;
          err = WebPMuxSetAnimationParams(mux, &params);
          ok = (err == WEBP_MUX_OK);
          if (!ok) {
            ERROR_GOTO2("ERROR (%s): Could not set animation parameters.\n",
                        ErrorString(err), Err2);
          }
          break;
        }
        default: {
          ERROR_GOTO1("ERROR: Invalid feature for action 'set'.\n", Err2);
          break;
        }
      }
      ok = WriteWebP(mux, config->output_);
      break;
    }
    case ACTION_DURATION: {
      int num_frames;
      ok = CreateMux(config->input_, &mux);
      if (!ok) goto Err2;
      err = WebPMuxNumChunks(mux, WEBP_CHUNK_ANMF, &num_frames);
      ok = (err == WEBP_MUX_OK);
      if (!ok) {
        ERROR_GOTO1("ERROR: can not parse the number of frames.\n", Err2);
      }
      if (num_frames == 0) {
        fprintf(stderr, "Doesn't look like the source is animated. "
                        "Skipping duration setting.\n");
        ok = WriteWebP(mux, config->output_);
        if (!ok) goto Err2;
      } else {
        int i;
        int* durations = NULL;
        WebPMux* new_mux = DuplicateMuxHeader(mux);
        if (new_mux == NULL) goto Err2;
        durations = (int*)WebPMalloc((size_t)num_frames * sizeof(*durations));
        if (durations == NULL) goto Err2;
        for (i = 0; i < num_frames; ++i) durations[i] = -1;

        // Parse intervals to process.
        for (i = 0; i < config->arg_count_; ++i) {
          int k;
          int args[3];
          int duration, start, end;
          const int nb_args = ExUtilGetInts(config->args_[i].params_,
                                            10, 3, args);
          ok = (nb_args >= 1);
          if (!ok) goto Err3;
          duration = args[0];
          if (duration < 0) {
            ERROR_GOTO1("ERROR: duration must be strictly positive.\n", Err3);
          }

          if (nb_args == 1) {   // only duration is present -> use full interval
            start = 1;
            end = num_frames;
          } else {
            start = args[1];
            if (start <= 0) {
              start = 1;
            } else if (start > num_frames) {
              start = num_frames;
            }
            end = (nb_args >= 3) ? args[2] : start;
            if (end == 0 || end > num_frames) end = num_frames;
          }

          for (k = start; k <= end; ++k) {
            assert(k >= 1 && k <= num_frames);
            durations[k - 1] = duration;
          }
        }

        // Apply non-negative durations to their destination frames.
        for (i = 1; i <= num_frames; ++i) {
          WebPMuxFrameInfo frame;
          err = WebPMuxGetFrame(mux, i, &frame);
          if (err != WEBP_MUX_OK || frame.id != WEBP_CHUNK_ANMF) {
            ERROR_GOTO2("ERROR: can not retrieve frame #%d.\n", i, Err3);
          }
          if (durations[i - 1] >= 0) frame.duration = durations[i - 1];
          err = WebPMuxPushFrame(new_mux, &frame, 1);
          if (err != WEBP_MUX_OK) {
            ERROR_GOTO2("ERROR: error push frame data #%d\n", i, Err3);
          }
          WebPDataClear(&frame.bitstream);
        }
        WebPMuxDelete(mux);
        ok = WriteWebP(new_mux, config->output_);
        mux = new_mux;  // transfer for the WebPMuxDelete() call
        new_mux = NULL;

 Err3:
        WebPFree(durations);
        WebPMuxDelete(new_mux);
        if (!ok) goto Err2;
      }
      break;
    }
    case ACTION_STRIP: {
      ok = CreateMux(config->input_, &mux);
      if (!ok) goto Err2;
      if (config->type_ == FEATURE_ICCP || config->type_ == FEATURE_EXIF ||
          config->type_ == FEATURE_XMP) {
        err = WebPMuxDeleteChunk(mux, kFourccList[config->type_]);
        if (err != WEBP_MUX_OK) {
          ERROR_GOTO3("ERROR (%s): Could not strip the %s.\n",
                      ErrorString(err), kDescriptions[config->type_], Err2);
        }
      } else {
        ERROR_GOTO1("ERROR: Invalid feature for action 'strip'.\n", Err2);
        break;
      }
      ok = WriteWebP(mux, config->output_);
      break;
    }
    case ACTION_INFO: {
      ok = CreateMux(config->input_, &mux);
      if (!ok) goto Err2;
      ok = (DisplayInfo(mux) == WEBP_MUX_OK);
      break;
    }
    default: {
      assert(0);  // Invalid action.
      break;
    }
  }

 Err2:
  WebPMuxDelete(mux);
  return ok;
}